

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void update_theme(natwm_state *state,client *client,uint16_t previous_border_width)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  color_value *pcVar6;
  workspace *workspace_00;
  monitor *monitor_00;
  xcb_rectangle_t xVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar8;
  uint local_74;
  uint local_70;
  uint32_t client_values [3];
  uint16_t client_mask;
  int32_t diff_1;
  int32_t diff;
  int32_t total_monitor_height;
  int32_t total_client_height;
  int32_t total_monitor_width;
  int32_t total_client_width;
  int32_t total_border;
  xcb_rectangle_t monitor_rect;
  monitor *monitor;
  workspace *workspace;
  color_value *border_color;
  uint16_t current_border_width;
  uint16_t previous_border_width_local;
  client *client_local;
  natwm_state *state_local;
  
  uVar8 = 0x107472;
  if ((client->is_fullscreen & 1U) == 0) {
    uVar1 = client_get_active_border_width(state->workspace_list->theme,client);
    pcVar6 = client_get_active_border_color(state->workspace_list->theme,client);
    xcb_change_window_attributes(state->xcb,client->window,8,&pcVar6->color_value,in_R8,in_R9,uVar8)
    ;
    if ((client->state & CLIENT_UNTHEMED) != 0) {
      client->state = client->state & 0xef;
    }
    if (previous_border_width != uVar1) {
      workspace_00 = workspace_list_find_client_workspace(state->workspace_list,client);
      if (workspace_00 == (workspace *)0x0) {
        internal_logger(natwm_logger,LEVEL_WARNING,"Failed to find workspace during update_theme");
      }
      else {
        monitor_00 = monitor_list_get_workspace_monitor(state->monitor_list,workspace_00);
        if (monitor_00 == (monitor *)0x0) {
          internal_logger(natwm_logger,LEVEL_WARNING,"Failed to find monitor during update_theme");
        }
        else {
          xVar7 = monitor_get_offset_rect(monitor_00);
          iVar2 = (uint)(client->rect).width + (int)(client->rect).x + (uint)uVar1 * 2;
          total_border._0_2_ = xVar7.width;
          iVar3 = (uint)(ushort)total_border + (uint)(monitor_00->offsets).left;
          iVar4 = (uint)(client->rect).height + (int)(client->rect).y + (uint)uVar1 * 2;
          total_border._2_2_ = xVar7.height;
          iVar5 = (uint)total_border._2_2_ + (uint)(monitor_00->offsets).top;
          if (iVar3 < iVar2) {
            (client->rect).width = (client->rect).width - ((short)iVar2 - (short)iVar3);
          }
          if (iVar5 < iVar4) {
            client_values[2] = iVar4 - iVar5;
            (client->rect).height = (client->rect).height - (short)client_values[2];
          }
          client_values[1]._2_2_ = 0x1c;
          local_74 = (uint)(client->rect).width;
          local_70 = (uint)(client->rect).height;
          client_values[0] = (uint32_t)uVar1;
          xcb_configure_window(state->xcb,client->window,0x1c,&local_74);
          client_update_hints(state,client,FRAME_EXTENTS);
        }
      }
    }
  }
  return;
}

Assistant:

static void update_theme(const struct natwm_state *state, struct client *client,
                         uint16_t previous_border_width)
{
        if (client->is_fullscreen) {
                // No need to upate theme if client is fullscreen
                return;
        }

        uint16_t current_border_width
                = client_get_active_border_width(state->workspace_list->theme, client);
        const struct color_value *border_color
                = client_get_active_border_color(state->workspace_list->theme, client);

        xcb_change_window_attributes(
                state->xcb, client->window, XCB_CW_BORDER_PIXEL, &border_color->color_value);

        // If this is the first time the client has been themed, we need to
        // update the clients state to remove UNTHEMED
        if (client->state & CLIENT_UNTHEMED) {
                client->state &= (uint8_t)~CLIENT_UNTHEMED;
        }

        if (previous_border_width == current_border_width) {
                return;
        }

        struct workspace *workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);

        if (workspace == NULL) {
                LOG_WARNING(natwm_logger, "Failed to find workspace during update_theme");

                return;
        }

        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (monitor == NULL) {
                LOG_WARNING(natwm_logger, "Failed to find monitor during update_theme");

                return;
        }

        xcb_rectangle_t monitor_rect = monitor_get_offset_rect(monitor);

        int32_t total_border = (current_border_width * 2);

        int32_t total_client_width = (client->rect.width + client->rect.x + total_border);
        int32_t total_monitor_width = (monitor_rect.width + monitor->offsets.left);

        int32_t total_client_height = (client->rect.height + client->rect.y + total_border);
        int32_t total_monitor_height = (monitor_rect.height + monitor->offsets.top);

        // Check if either the width or the height will not be able to fit on
        // the monitor. If either doesn't correct the width to fit
        if (total_client_width > total_monitor_width) {
                int32_t diff = total_client_width - total_monitor_width;

                client->rect.width = (uint16_t)(client->rect.width - diff);
        }

        if (total_client_height > total_monitor_height) {
                int32_t diff = total_client_height - total_monitor_height;

                client->rect.height = (uint16_t)(client->rect.height - diff);
        }

        // Update the client
        uint16_t client_mask = XCB_CONFIG_WINDOW_WIDTH | XCB_CONFIG_WINDOW_HEIGHT
                | XCB_CONFIG_WINDOW_BORDER_WIDTH;
        uint32_t client_values[] = {
                client->rect.width,
                client->rect.height,
                current_border_width,
        };

        xcb_configure_window(state->xcb, client->window, client_mask, client_values);

        client_update_hints(state, client, FRAME_EXTENTS);
}